

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

tmbstr prvTidytmbstrdup(TidyAllocator *allocator,ctmbstr str)

{
  char cVar1;
  uint uVar2;
  char *local_30;
  tmbstr cp;
  char *pcStack_20;
  uint len;
  tmbstr s;
  ctmbstr str_local;
  TidyAllocator *allocator_local;
  
  pcStack_20 = (char *)0x0;
  if (str != (ctmbstr)0x0) {
    uVar2 = prvTidytmbstrlen(str);
    pcStack_20 = (char *)(*allocator->vtbl->alloc)(allocator,(long)uVar2 + 1);
    local_30 = pcStack_20;
    s = str;
    do {
      cVar1 = *s;
      *local_30 = cVar1;
      local_30 = local_30 + 1;
      s = s + 1;
    } while (cVar1 != '\0');
  }
  return pcStack_20;
}

Assistant:

tmbstr TY_(tmbstrdup)( TidyAllocator *allocator, ctmbstr str )
{
    tmbstr s = NULL;
    if ( str )
    {
        uint len = TY_(tmbstrlen)( str );
        tmbstr cp = s = (tmbstr) TidyAlloc( allocator, 1+len );
        while ( 0 != (*cp++ = *str++) )
            /**/;
    }
    return s;
}